

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtaddPairwise<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_28.v128_.v = (v128)Pop(this);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(ushort *)((long)&local_18 + lVar1 * 2) =
         (ushort)*(byte *)((long)&local_28 + lVar1 * 2 + 1) +
         (ushort)*(byte *)((long)&local_28 + lVar1 * 2);
  }
  Push(this,(Value)local_18.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtaddPairwise() {
  auto val = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    result[i] = U(val[laneidx]) + U(val[laneidx + 1]);
  }
  Push(result);
  return RunResult::Ok;
}